

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O0

void Omega_h::gmsh::anon_unknown_0::read_internal_entities_section
               (Mesh *mesh,Real format,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *physical_names,istream *stream,bool is_binary,bool needs_swapping)

{
  initializer_list<std::pair<int,_int>_> __l;
  bool bVar1;
  reference __k;
  vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *pvVar2;
  reference ppVar3;
  int iVar4;
  int local_208;
  int local_204;
  Int points_tag;
  Int num_bounding_points;
  value_type *physical_name;
  Int physical_1;
  Int num_physicals_1;
  Vector<3> max_point;
  Vector<3> min_point;
  int local_1b8;
  Int tag_1;
  int dim;
  int num_elements;
  pair<int,_int> param;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range2;
  allocator<std::pair<int,_int>_> local_17d;
  int local_17c [3];
  pair<int,_int> local_170;
  pair<int,_int> local_168;
  pair<int,_int> local_160;
  pair<int,_int> *local_158;
  size_type local_150;
  undefined1 local_148 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> params;
  value_type *physicalname;
  Int physical;
  Int num_physicals;
  Vector<3> point;
  Int tag;
  Int num_volumes;
  Int num_surfaces;
  Int num_curves;
  Int num_points;
  bool needs_swapping_local;
  bool is_binary_local;
  istream *stream_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *physical_names_local;
  Real format_local;
  Mesh *mesh_local;
  Int *local_c0;
  undefined4 local_b4;
  Int *local_b0;
  undefined4 local_a4;
  double *local_a0;
  undefined4 local_94;
  double *local_90;
  undefined4 local_84;
  double *local_80;
  undefined4 local_74;
  double *local_70;
  undefined4 local_64;
  Int *local_60;
  undefined4 local_54;
  Int *local_50;
  undefined4 local_44;
  double *local_40;
  undefined4 local_34;
  Int *local_30;
  undefined4 local_24;
  Int *local_20;
  undefined4 local_14;
  double *local_10;
  
  num_curves._2_1_ = needs_swapping;
  num_curves._3_1_ = is_binary;
  _num_points = stream;
  stream_local = (istream *)physical_names;
  physical_names_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)format;
  format_local = (Real)mesh;
  read<int>(stream,&num_surfaces,is_binary,needs_swapping);
  read<int>(_num_points,&num_volumes,(bool)(num_curves._3_1_ & 1),(bool)(num_curves._2_1_ & 1));
  read<int>(_num_points,&tag,(bool)(num_curves._3_1_ & 1),(bool)(num_curves._2_1_ & 1));
  read<int>(_num_points,(int *)((long)point.super_Few<double,_3>.array_ + 0x14),
            (bool)(num_curves._3_1_ & 1),(bool)(num_curves._2_1_ & 1));
  do {
    if (num_surfaces < 1) {
      local_17c[2] = 2;
      num_surfaces = num_surfaces + -1;
      std::pair<int,_int>::pair<int_&,_int,_true>(&local_170,&num_volumes,local_17c + 2);
      local_17c[1] = 2;
      std::pair<int,_int>::pair<int_&,_int,_true>(&local_168,&tag,local_17c + 1);
      local_17c[0] = 3;
      std::pair<int,_int>::pair<int_&,_int,_true>
                (&local_160,(int *)((long)point.super_Few<double,_3>.array_ + 0x14),local_17c);
      local_150 = 3;
      local_158 = &local_170;
      std::allocator<std::pair<int,_int>_>::allocator(&local_17d);
      __l._M_len = local_150;
      __l._M_array = local_158;
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_148,__l
                 ,&local_17d);
      std::allocator<std::pair<int,_int>_>::~allocator(&local_17d);
      __end2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          local_148);
      param = (pair<int,_int>)
              std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         local_148);
      do {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                    *)&param);
        if (!bVar1) {
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_148
                    );
          return;
        }
        ppVar3 = __gnu_cxx::
                 __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&__end2);
        _dim = *ppVar3;
        tag_1 = dim;
        local_1b8 = num_elements;
        while (0 < tag_1) {
          tag_1 = tag_1 + -1;
          read<int>(_num_points,(int *)((long)min_point.super_Few<double,_3>.array_ + 0x14),
                    (bool)(num_curves._3_1_ & 1),(bool)(num_curves._2_1_ & 1));
          local_70 = max_point.super_Few<double,_3>.array_ + 2;
          local_74 = 0;
          read<double>(_num_points,local_70,(bool)(num_curves._3_1_ & 1),
                       (bool)(num_curves._2_1_ & 1));
          local_80 = max_point.super_Few<double,_3>.array_ + 2;
          local_84 = 1;
          read<double>(_num_points,(double *)&min_point,(bool)(num_curves._3_1_ & 1),
                       (bool)(num_curves._2_1_ & 1));
          local_90 = max_point.super_Few<double,_3>.array_ + 2;
          local_94 = 2;
          read<double>(_num_points,min_point.super_Few<double,_3>.array_ + 1,
                       (bool)(num_curves._3_1_ & 1),(bool)(num_curves._2_1_ & 1));
          local_a0 = (double *)&physical_1;
          local_a4 = 0;
          read<double>(_num_points,local_a0,(bool)(num_curves._3_1_ & 1),
                       (bool)(num_curves._2_1_ & 1));
          local_b0 = &physical_1;
          local_b4 = 1;
          read<double>(_num_points,(double *)&max_point,(bool)(num_curves._3_1_ & 1),
                       (bool)(num_curves._2_1_ & 1));
          local_c0 = &physical_1;
          mesh_local._4_4_ = 2;
          read<double>(_num_points,max_point.super_Few<double,_3>.array_ + 1,
                       (bool)(num_curves._3_1_ & 1),(bool)(num_curves._2_1_ & 1));
          read<int>(_num_points,(int *)((long)&physical_name + 4),(bool)(num_curves._3_1_ & 1),
                    (bool)(num_curves._2_1_ & 1));
          while (0 < physical_name._4_4_) {
            physical_name._4_4_ = physical_name._4_4_ + -1;
            read<int>(_num_points,(int *)&physical_name,(bool)(num_curves._3_1_ & 1),
                      (bool)(num_curves._2_1_ & 1));
            if ((int)physical_name == 0) {
              fail("assertion %s failed at %s +%d\n","physical != 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                   ,199);
            }
            if (0 < (int)physical_name) {
              _points_tag = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)stream_local,(long)((int)physical_name + -1));
              pvVar2 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                                     *)((long)format_local + 0x3a8),_points_tag);
              std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
              emplace_back<int_const&,int&>
                        (pvVar2,&local_1b8,
                         (int *)((long)min_point.super_Few<double,_3>.array_ + 0x14));
            }
          }
          physical_name._4_4_ = physical_name._4_4_ + -1;
          read<int>(_num_points,&local_204,(bool)(num_curves._3_1_ & 1),(bool)(num_curves._2_1_ & 1)
                   );
          while (iVar4 = local_204 + -1, bVar1 = 0 < local_204, local_204 = iVar4, bVar1) {
            read<int>(_num_points,&local_208,(bool)(num_curves._3_1_ & 1),
                      (bool)(num_curves._2_1_ & 1));
          }
        }
        tag_1 = tag_1 + -1;
        __gnu_cxx::
        __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&__end2);
      } while( true );
    }
    num_surfaces = num_surfaces + -1;
    read<int>(_num_points,(int *)(point.super_Few<double,_3>.array_ + 2),
              (bool)(num_curves._3_1_ & 1),(bool)(num_curves._2_1_ & 1));
    local_10 = (double *)&physical;
    local_14 = 0;
    read<double>(_num_points,local_10,(bool)(num_curves._3_1_ & 1),(bool)(num_curves._2_1_ & 1));
    local_20 = &physical;
    local_24 = 1;
    read<double>(_num_points,(double *)&point,(bool)(num_curves._3_1_ & 1),
                 (bool)(num_curves._2_1_ & 1));
    local_30 = &physical;
    local_34 = 2;
    read<double>(_num_points,point.super_Few<double,_3>.array_ + 1,(bool)(num_curves._3_1_ & 1),
                 (bool)(num_curves._2_1_ & 1));
    if (((double)physical_names_local == 4.0) && (!NAN((double)physical_names_local))) {
      local_40 = (double *)&physical;
      local_44 = 0;
      read<double>(_num_points,local_40,(bool)(num_curves._3_1_ & 1),(bool)(num_curves._2_1_ & 1));
      local_50 = &physical;
      local_54 = 1;
      read<double>(_num_points,(double *)&point,(bool)(num_curves._3_1_ & 1),
                   (bool)(num_curves._2_1_ & 1));
      local_60 = &physical;
      local_64 = 2;
      read<double>(_num_points,point.super_Few<double,_3>.array_ + 1,(bool)(num_curves._3_1_ & 1),
                   (bool)(num_curves._2_1_ & 1));
    }
    read<int>(_num_points,(int *)((long)&physicalname + 4),(bool)(num_curves._3_1_ & 1),
              (bool)(num_curves._2_1_ & 1));
    while (iVar4 = physicalname._4_4_ + -1, bVar1 = 0 < physicalname._4_4_,
          physicalname._4_4_ = iVar4, bVar1) {
      read<int>(_num_points,(int *)&physicalname,(bool)(num_curves._3_1_ & 1),
                (bool)(num_curves._2_1_ & 1));
      if ((int)physicalname == 0) {
        fail("assertion %s failed at %s +%d\n","physical != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0xac);
      }
      if (0 < (int)physicalname) {
        __k = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)stream_local,(long)((int)physicalname + -1));
        pvVar2 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                               *)((long)format_local + 0x3a8),__k);
        params.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::emplace_back<int,int&>
                  (pvVar2,(int *)((long)&params.
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                   (int *)(point.super_Few<double,_3>.array_ + 2));
      }
    }
  } while( true );
}

Assistant:

static void read_internal_entities_section(Mesh& mesh, Real format,
    std::vector<std::string>& physical_names, std::istream& stream,
    bool is_binary, bool needs_swapping) {
  Int num_points, num_curves, num_surfaces, num_volumes;
  read(stream, num_points, is_binary, needs_swapping);
  read(stream, num_curves, is_binary, needs_swapping);
  read(stream, num_surfaces, is_binary, needs_swapping);
  read(stream, num_volumes, is_binary, needs_swapping);
  while (num_points-- > 0) {
    Int tag;
    Vector<3> point;
    Int num_physicals;
    read(stream, tag, is_binary, needs_swapping);
    read(stream, point[0], is_binary, needs_swapping);
    read(stream, point[1], is_binary, needs_swapping);
    read(stream, point[2], is_binary, needs_swapping);
    if (format == 4.0) {
      // strangely, the point is specified twice in 4.0, not 4.1
      read(stream, point[0], is_binary, needs_swapping);
      read(stream, point[1], is_binary, needs_swapping);
      read(stream, point[2], is_binary, needs_swapping);
    }
    read(stream, num_physicals, is_binary, needs_swapping);
    while (num_physicals-- > 0) {
      Int physical;
      read(stream, physical, is_binary, needs_swapping);
      OMEGA_H_CHECK(physical != 0);
      if (physical > 0) {
        const auto& physicalname = physical_names[physical - 1];
        mesh.class_sets[physicalname].emplace_back(0, tag);
      }
    }
  }
  const std::vector<std::pair<Int, Int>> params{
      {num_curves, 2}, {num_surfaces, 2}, {num_volumes, 3}};
  for (auto param : params) {
    auto num_elements = param.first;
    const auto dim = param.second;
    while (num_elements-- > 0) {
      Int tag;
      Vector<3> min_point, max_point;
      Int num_physicals;
      read(stream, tag, is_binary, needs_swapping);
      read(stream, min_point[0], is_binary, needs_swapping);
      read(stream, min_point[1], is_binary, needs_swapping);
      read(stream, min_point[2], is_binary, needs_swapping);
      read(stream, max_point[0], is_binary, needs_swapping);
      read(stream, max_point[1], is_binary, needs_swapping);
      read(stream, max_point[2], is_binary, needs_swapping);
      read(stream, num_physicals, is_binary, needs_swapping);
      while (num_physicals-- > 0) {
        Int physical;
        read(stream, physical, is_binary, needs_swapping);
        OMEGA_H_CHECK(physical != 0);
        if (physical > 0) {
          const auto& physical_name = physical_names[physical - 1];
          mesh.class_sets[physical_name].emplace_back(dim, tag);
        }
      }
      Int num_bounding_points;
      read(stream, num_bounding_points, is_binary, needs_swapping);
      while (num_bounding_points-- > 0) {
        Int points_tag;
        read(stream, points_tag, is_binary, needs_swapping);
      }
    }
  }
}